

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex.c
# Opt level: O3

int re_compile_and_search
              (re_context *ctx,char *pattern,size_t patlen,char *searchstr,size_t searchlen,
              int *result_len)

{
  char *__string;
  re_status_t rVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  size_t sVar5;
  re_machine machine;
  re_machine local_38;
  
  rVar1 = re_compile(ctx,pattern,patlen,&local_38);
  uVar3 = 0xffffffff;
  if (rVar1 == RE_STATUS_SUCCESS) {
    re_save_search_str(ctx,searchstr,searchlen);
    memset(ctx->regs,0,0xa0);
    sVar5 = ctx->curlen;
    uVar4 = (uint)sVar5;
    if (0 < (int)uVar4) {
      __string = ctx->strbuf;
      uVar3 = 0;
      do {
        iVar2 = re_match((re_pattern_buffer *)ctx,__string,(int)__string + (int)uVar3,(int)sVar5,
                         (re_registers *)&local_38);
        if (-1 < iVar2) {
          *result_len = iVar2;
          goto LAB_00131421;
        }
        uVar3 = uVar3 + 1;
        sVar5 = sVar5 - 1;
      } while ((uVar4 & 0x7fffffff) != uVar3);
      uVar3 = 0xffffffff;
    }
  }
LAB_00131421:
  return (int)uVar3;
}

Assistant:

int re_compile_and_search(re_context *ctx,
                          const char *pattern, size_t patlen,
                          const char *searchstr, size_t searchlen,
                          int *result_len)
{
    re_machine machine;
    
    /* compile the expression - return failure if we get an error */
    if (re_compile(ctx, pattern, patlen, &machine) != RE_STATUS_SUCCESS)
        return -1;

    /* save the search string in our internal buffer */
    re_save_search_str(ctx, searchstr, searchlen);

    /* clear the group registers */
    memset(ctx->regs, 0, sizeof(ctx->regs));

    /* 
     *   search for the pattern in our copy of the string - use the copy
     *   so that the group registers stay valid even if the caller
     *   deallocates the original string after we return
     */
    return re_search(ctx, ctx->strbuf, ctx->curlen, &machine,
                     ctx->regs, result_len);
}